

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

bool __thiscall MathInterpreter::isNumber(MathInterpreter *this,string *s)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  uint local_28;
  uint local_24;
  uint count;
  uint i;
  string *s_local;
  MathInterpreter *this_local;
  
  local_24 = 1;
  local_28 = 0;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
  if (((('9' < *pcVar1) ||
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar1 < '0')) &&
      ((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), 'Z' < *pcVar1 ||
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar1 < 'A')))) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar1 != '-')) {
    return false;
  }
  do {
    uVar2 = std::__cxx11::string::size();
    bVar3 = false;
    if (local_24 < uVar2) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar1 < ':') {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
        bVar3 = true;
        if ('/' < *pcVar1) goto LAB_0011c9ca;
      }
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
      bVar3 = *pcVar1 == '.';
    }
LAB_0011c9ca:
    if (!bVar3) {
      uVar2 = std::__cxx11::string::size();
      if ((uVar2 < 2) ||
         ((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar1 == '-' &&
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar1 == '.')))) {
        uVar2 = std::__cxx11::string::size();
        if (1 < uVar2) {
          return false;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
        if (*pcVar1 == '-') {
          return false;
        }
      }
      uVar2 = std::__cxx11::string::size();
      if (local_24 != uVar2) {
        return false;
      }
      if (1 < local_28) {
        return false;
      }
      return true;
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar1 == '.') {
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool MathInterpreter::isNumber(string s) {
  unsigned int i = 1, count = 0;
  if (((s[0] <= '9') && (s[0] >= '0')) || ((s[0] <= 'Z') && (s[0] >= 'A'))
      || (s[0] == '-')) {
    while ((i < s.size())
        && (((s[i] <= '9') && (s[i] >= '0')) || (s[i] == '.'))) {
      if (s[i] == '.') {
        count++;
      }
      i++;
    }
    if (((s.size() >= 2) && (!((s[0] == '-') && (s[1] == '.'))))
        || ((s.size() < 2) && (!(s[0] == '-')))) {
      if ((i == s.size()) && (count <= 1)) {
        return true;
      }
    }
  }
  return false;
}